

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,bool>
          (TryCast *this,string_t input,bool *result,bool strict)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined1 uVar10;
  char cVar11;
  char *pcVar12;
  char cVar13;
  char cVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  
  pcVar12 = input.value._0_8_;
  bVar1 = (byte)result;
  uVar9 = (uint)this;
  cVar2 = (char)((ulong)this >> 0x20);
  cVar13 = (char)((ulong)this >> 0x28);
  cVar14 = (char)((ulong)this >> 0x30);
  cVar11 = (char)((ulong)this >> 0x38);
  switch(uVar9) {
  case 1:
    if (0xc < uVar9) {
      cVar2 = *pcVar12;
    }
    uVar9 = tolower((int)cVar2);
    uVar9 = uVar9 & 0xff;
    uVar10 = 1;
    if ((((uVar9 == 0x31 & (bVar1 ^ 1)) == 0) && (uVar9 != 0x74)) && (uVar9 != 0x79 || bVar1 != 0))
    {
      uVar10 = 0;
      if ((((uVar9 == 0x30 & (bVar1 ^ 1)) == 0) && (uVar9 != 0x66)) && (uVar9 != 0x6e || bVar1 != 0)
         ) {
        return false;
      }
    }
    goto LAB_0126e6f1;
  case 2:
    if (0xc < uVar9) {
      cVar2 = *pcVar12;
    }
    uVar4 = tolower((int)cVar2);
    if (0xc < uVar9) {
      cVar13 = pcVar12[1];
    }
    uVar9 = tolower((int)cVar13);
    bVar3 = (uVar9 & 0xff) == 0x6f;
    bVar18 = (uVar4 & 0xff) == 0x6e;
    if (!bVar3 || !bVar18) {
      return bVar3 && bVar18;
    }
    break;
  case 3:
    if (0xc < uVar9) {
      cVar2 = *pcVar12;
    }
    uVar4 = tolower((int)cVar2);
    if (0xc < uVar9) {
      cVar13 = pcVar12[1];
    }
    uVar5 = tolower((int)cVar13);
    if (0xc < uVar9) {
      cVar14 = pcVar12[2];
    }
    iVar6 = tolower((int)cVar14);
    bVar18 = (uVar5 & 0xff) == 0x65 && (uVar4 & 0xff) == 0x79;
    bVar3 = (char)iVar6 == 's';
    goto LAB_0126e6ab;
  case 4:
    if (0xc < uVar9) {
      cVar2 = *pcVar12;
    }
    uVar4 = tolower((int)cVar2);
    if (0xc < uVar9) {
      cVar13 = pcVar12[1];
    }
    uVar5 = tolower((int)cVar13);
    if (0xc < uVar9) {
      cVar14 = pcVar12[2];
    }
    iVar6 = tolower((int)cVar14);
    if (0xc < uVar9) {
      cVar11 = pcVar12[3];
    }
    iVar7 = tolower((int)cVar11);
    bVar18 = (uVar5 & 0xff) == 0x72 && (uVar4 & 0xff) == 0x74;
    bVar3 = (char)iVar7 == 'e' && (char)iVar6 == 'u';
LAB_0126e6ab:
    uVar10 = 1;
    if (!(bool)(bVar3 & bVar18)) {
      return false;
    }
    goto LAB_0126e6f1;
  case 5:
    if (0xc < uVar9) {
      cVar2 = *pcVar12;
    }
    uVar4 = tolower((int)cVar2);
    if (0xc < uVar9) {
      cVar13 = pcVar12[1];
    }
    uVar5 = tolower((int)cVar13);
    if (0xc < uVar9) {
      cVar14 = pcVar12[2];
    }
    iVar6 = tolower((int)cVar14);
    if (0xc < uVar9) {
      cVar11 = pcVar12[3];
    }
    iVar7 = tolower((int)cVar11);
    if (0xc < uVar9) {
      pcVar12 = (char *)(ulong)(byte)pcVar12[4];
    }
    iVar8 = tolower((int)(char)pcVar12);
    bVar3 = (uVar5 & 0xff) == 0x61;
    bVar18 = (uVar4 & 0xff) == 0x66;
    bVar15 = (char)iVar6 == 'l';
    bVar16 = (char)iVar7 == 's';
    bVar17 = (char)iVar8 == 'e';
    if ((!bVar17 || (!bVar16 || !bVar15)) || (!bVar3 || !bVar18)) {
      return (bVar17 && (bVar16 && bVar15)) && (bVar3 && bVar18);
    }
    break;
  default:
    return false;
  }
  uVar10 = 0;
LAB_0126e6f1:
  *input.value._8_8_ = uVar10;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, bool &result, bool strict) {
	auto input_data = reinterpret_cast<const char *>(input.GetData());
	auto input_size = input.GetSize();
	return TryCastStringBool(input_data, input_size, result, strict);
}